

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O0

uint xSAT_SolverClaNew(xSAT_Solver_t *s,Vec_Int_t *vLits,int fLearnt)

{
  int iVar1;
  xSAT_VecWatchList_t *pxVar2;
  xSAT_Watcher_t e;
  xSAT_Watcher_t e_00;
  xSAT_Watcher_t e_01;
  xSAT_Watcher_t e_02;
  int iVar3;
  uint h;
  int iVar4;
  xSAT_Clause_t *pCla_00;
  int *__src;
  xSAT_WatchList_t *pxVar5;
  uint nWords;
  xSAT_Watcher_t w2;
  xSAT_Watcher_t w1;
  xSAT_Clause_t *pCla;
  uint CRef;
  int fLearnt_local;
  Vec_Int_t *vLits_local;
  xSAT_Solver_t *s_local;
  
  iVar3 = Vec_IntSize(vLits);
  if (iVar3 < 2) {
    __assert_fail("Vec_IntSize( vLits ) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatSolver.c"
                  ,0x115,"unsigned int xSAT_SolverClaNew(xSAT_Solver_t *, Vec_Int_t *, int)");
  }
  if ((fLearnt != 0) && (fLearnt != 1)) {
    __assert_fail("fLearnt == 0 || fLearnt == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatSolver.c"
                  ,0x116,"unsigned int xSAT_SolverClaNew(xSAT_Solver_t *, Vec_Int_t *, int)");
  }
  iVar3 = Vec_IntSize(vLits);
  h = xSAT_MemAppend(s->pMemory,fLearnt + 3 + iVar3);
  pCla_00 = xSAT_SolverReadClause(s,h);
  *(uint *)pCla_00 = *(uint *)pCla_00 & 0xfffffffe | fLearnt & 1U;
  *(uint *)pCla_00 = *(uint *)pCla_00 & 0xfffffffd;
  *(uint *)pCla_00 = *(uint *)pCla_00 & 0xfffffffb;
  *(uint *)pCla_00 = *(uint *)pCla_00 & 0xfffffff7 | (fLearnt & 1U) << 3;
  iVar3 = Vec_IntSize(vLits);
  pCla_00->nSize = iVar3;
  __src = Vec_IntArray(vLits);
  iVar3 = Vec_IntSize(vLits);
  memcpy(pCla_00 + 1,__src,(long)iVar3 << 2);
  if (fLearnt == 0) {
    Vec_IntPush(s->vClauses,h);
    iVar3 = Vec_IntSize(vLits);
    (s->Stats).nClauseLits = (long)iVar3 + (s->Stats).nClauseLits;
  }
  else {
    Vec_IntPush(s->vLearnts,h);
    iVar3 = xSAT_SolverClaCalcLBD2(s,vLits);
    *(uint *)pCla_00 = *(uint *)pCla_00 & 0xf | iVar3 << 4;
    *(undefined4 *)(&pCla_00[1].field_0x0 + (long)pCla_00->nSize * 4) = 0;
    iVar3 = Vec_IntSize(vLits);
    (s->Stats).nLearntLits = (long)iVar3 + (s->Stats).nLearntLits;
    xSAT_SolverClaActBump(s,pCla_00);
  }
  iVar3 = pCla_00[1].nSize;
  iVar1 = *(int *)(pCla_00 + 1);
  iVar4 = Vec_IntSize(vLits);
  if (iVar4 == 2) {
    pxVar2 = s->vBinWatches;
    iVar4 = xSAT_NegLit(*(int *)(pCla_00 + 1));
    pxVar5 = xSAT_VecWatchListEntry(pxVar2,iVar4);
    e_01.Blocker = iVar3;
    e_01.CRef = h;
    xSAT_WatchListPush(pxVar5,e_01);
    pxVar2 = s->vBinWatches;
    iVar3 = xSAT_NegLit(pCla_00[1].nSize);
    pxVar5 = xSAT_VecWatchListEntry(pxVar2,iVar3);
    e.Blocker = iVar1;
    e.CRef = h;
    xSAT_WatchListPush(pxVar5,e);
  }
  else {
    pxVar2 = s->vWatches;
    iVar4 = xSAT_NegLit(*(int *)(pCla_00 + 1));
    pxVar5 = xSAT_VecWatchListEntry(pxVar2,iVar4);
    e_02.Blocker = iVar3;
    e_02.CRef = h;
    xSAT_WatchListPush(pxVar5,e_02);
    pxVar2 = s->vWatches;
    iVar3 = xSAT_NegLit(pCla_00[1].nSize);
    pxVar5 = xSAT_VecWatchListEntry(pxVar2,iVar3);
    e_00.Blocker = iVar1;
    e_00.CRef = h;
    xSAT_WatchListPush(pxVar5,e_00);
  }
  return h;
}

Assistant:

unsigned xSAT_SolverClaNew( xSAT_Solver_t * s, Vec_Int_t * vLits , int fLearnt )
{
    unsigned CRef;
    xSAT_Clause_t * pCla;
    xSAT_Watcher_t w1;
    xSAT_Watcher_t w2;
    unsigned nWords;

    assert( Vec_IntSize( vLits ) > 1);
    assert( fLearnt == 0 || fLearnt == 1 );

    nWords = 3 + fLearnt + Vec_IntSize( vLits );
    CRef = xSAT_MemAppend( s->pMemory, nWords );
    pCla = xSAT_SolverReadClause( s, CRef );
    pCla->fLearnt = fLearnt;
    pCla->fMark = 0;
    pCla->fReallocd = 0;
    pCla->fCanBeDel = fLearnt;
    pCla->nSize = Vec_IntSize( vLits );
    memcpy( &( pCla->pData[0].Lit ), Vec_IntArray( vLits ), sizeof( int ) * Vec_IntSize( vLits ) );

    if ( fLearnt )
    {
        Vec_IntPush( s->vLearnts, CRef );
        pCla->nLBD = xSAT_SolverClaCalcLBD2( s, vLits );
        pCla->pData[pCla->nSize].Act = 0;
        s->Stats.nLearntLits += Vec_IntSize( vLits );
        xSAT_SolverClaActBump(s, pCla);
    }
    else
    {
        Vec_IntPush( s->vClauses, CRef );
        s->Stats.nClauseLits += Vec_IntSize( vLits );
    }

    w1.CRef = CRef;
    w2.CRef = CRef;
    w1.Blocker = pCla->pData[1].Lit;
    w2.Blocker = pCla->pData[0].Lit;

    if ( Vec_IntSize( vLits ) == 2 )
    {
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vBinWatches, xSAT_NegLit( pCla->pData[0].Lit ) ), w1 );
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vBinWatches, xSAT_NegLit( pCla->pData[1].Lit ) ), w2 );
    }
    else
    {
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit( pCla->pData[0].Lit ) ), w1 );
        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit( pCla->pData[1].Lit ) ), w2 );
    }
    return CRef;
}